

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substring.cpp
# Opt level: O2

void duckdb::SubstringFunction<duckdb::SubstringUnicodeOp>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  VectorType VVar2;
  unsigned_long *puVar3;
  data_ptr_t pdVar4;
  reference vector;
  reference vector_00;
  reference this;
  idx_t iVar5;
  ulong uVar6;
  undefined8 uVar7;
  idx_t iVar8;
  ulong uVar9;
  undefined8 uVar10;
  anon_union_16_2_67f50693_for_value *paVar11;
  ulong uVar12;
  ulong uVar13;
  data_ptr_t pdVar14;
  long lVar15;
  idx_t iVar16;
  ulong uVar17;
  Vector *result_00;
  idx_t iVar18;
  int64_t offset;
  int64_t in_R9;
  idx_t iVar19;
  ulong uVar20;
  data_ptr_t pdVar21;
  ulong uVar22;
  data_ptr_t pdVar23;
  bool bVar24;
  anon_struct_16_3_d7536bce_for_pointer aVar25;
  string_t sVar26;
  string_t input;
  string_t input_00;
  string_t input_01;
  string_t input_02;
  string_t input_03;
  string_t input_04;
  string_t input_05;
  string_t input_06;
  string_t input_07;
  string_t input_08;
  string_t input_09;
  string_t input_10;
  string_t input_11;
  idx_t local_130;
  UnifiedVectorFormat bdata;
  UnifiedVectorFormat adata;
  UnifiedVectorFormat local_78;
  
  vector = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  if ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start == 0x138) {
    this = vector<duckdb::Vector,_true>::get<true>(&args->data,2);
    iVar16 = args->count;
    if (((vector->vector_type != CONSTANT_VECTOR) || (vector_00->vector_type != CONSTANT_VECTOR)) ||
       (this->vector_type != CONSTANT_VECTOR)) {
      Vector::SetVectorType(result,FLAT_VECTOR);
      UnifiedVectorFormat::UnifiedVectorFormat(&adata);
      UnifiedVectorFormat::UnifiedVectorFormat(&bdata);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
      Vector::ToUnifiedFormat(vector,iVar16,&adata);
      Vector::ToUnifiedFormat(vector_00,iVar16,&bdata);
      Vector::ToUnifiedFormat(this,iVar16,&local_78);
      pdVar21 = result->data;
      FlatVector::VerifyFlatVector(result);
      if (((adata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) &&
          (bdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0)) &&
         (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0)) {
        pdVar21 = pdVar21 + 8;
        for (iVar19 = 0; iVar16 != iVar19; iVar19 = iVar19 + 1) {
          iVar5 = iVar19;
          if ((adata.sel)->sel_vector != (sel_t *)0x0) {
            iVar5 = (idx_t)(adata.sel)->sel_vector[iVar19];
          }
          iVar8 = iVar19;
          if ((bdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar8 = (idx_t)(bdata.sel)->sel_vector[iVar19];
          }
          iVar18 = iVar19;
          if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
            iVar18 = (idx_t)(local_78.sel)->sel_vector[iVar19];
          }
          input_00.value.pointer.ptr = (char *)*(undefined8 *)(bdata.data + iVar8 * 8);
          input_00.value._0_8_ = *(undefined8 *)(adata.data + iVar5 * 0x10 + 8);
          sVar26 = SubstringUnicode((duckdb *)result,*(Vector **)(adata.data + iVar5 * 0x10),
                                    input_00,*(int64_t *)(local_78.data + iVar18 * 8),in_R9);
          *(long *)(pdVar21 + -8) = sVar26.value._0_8_;
          *(long *)pdVar21 = sVar26.value._8_8_;
          pdVar21 = pdVar21 + 0x10;
        }
      }
      else {
        pdVar21 = pdVar21 + 8;
        for (iVar19 = 0; iVar16 != iVar19; iVar19 = iVar19 + 1) {
          iVar5 = iVar19;
          if ((adata.sel)->sel_vector != (sel_t *)0x0) {
            iVar5 = (idx_t)(adata.sel)->sel_vector[iVar19];
          }
          iVar8 = iVar19;
          if ((bdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar8 = (idx_t)(bdata.sel)->sel_vector[iVar19];
          }
          iVar18 = iVar19;
          if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
            iVar18 = (idx_t)(local_78.sel)->sel_vector[iVar19];
          }
          if ((((adata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                 (unsigned_long *)0x0) ||
               ((adata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar5 >> 6]
                 >> (iVar5 & 0x3f) & 1) != 0)) &&
              ((bdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0 ||
               ((bdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar8 >> 6]
                 >> (iVar8 & 0x3f) & 1) != 0)))) &&
             ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0 ||
              ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                [iVar18 >> 6] >> (iVar18 & 0x3f) & 1) != 0)))) {
            input_03.value.pointer.ptr = (char *)*(undefined8 *)(bdata.data + iVar8 * 8);
            input_03.value._0_8_ = *(undefined8 *)(adata.data + iVar5 * 0x10 + 8);
            sVar26 = SubstringUnicode((duckdb *)result,*(Vector **)(adata.data + iVar5 * 0x10),
                                      input_03,*(int64_t *)(local_78.data + iVar18 * 8),in_R9);
            *(long *)(pdVar21 + -8) = sVar26.value._0_8_;
            *(long *)pdVar21 = sVar26.value._8_8_;
          }
          else {
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar19);
          }
          pdVar21 = pdVar21 + 0x10;
        }
      }
      UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
LAB_0082b0dc:
      UnifiedVectorFormat::~UnifiedVectorFormat(&bdata);
      UnifiedVectorFormat::~UnifiedVectorFormat(&adata);
      return;
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) &&
        ((puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
         puVar3 == (unsigned_long *)0x0 || ((*puVar3 & 1) != 0)))) &&
       ((puVar3 = (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar3 == (unsigned_long *)0x0 || ((*puVar3 & 1) != 0)))) {
      paVar11 = (anon_union_16_2_67f50693_for_value *)result->data;
      result_00 = *(Vector **)vector->data;
      uVar10 = *(undefined8 *)(vector->data + 8);
      uVar7 = *(undefined8 *)vector_00->data;
      offset = *(int64_t *)this->data;
LAB_0082ac9e:
      input.value.pointer.ptr = (char *)uVar7;
      input.value._0_8_ = uVar10;
      aVar25 = (anon_struct_16_3_d7536bce_for_pointer)
               SubstringUnicode((duckdb *)result,result_00,input,offset,in_R9);
      paVar11->pointer = aVar25;
      return;
    }
  }
  else {
    VVar1 = vector->vector_type;
    VVar2 = vector_00->vector_type;
    if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      paVar11 = (anon_union_16_2_67f50693_for_value *)result->data;
      if (((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) &&
         ((puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
          puVar3 == (unsigned_long *)0x0 || ((*puVar3 & 1) != 0)))) {
        result_00 = *(Vector **)vector->data;
        uVar10 = *(undefined8 *)(vector->data + 8);
        uVar7 = *(undefined8 *)vector_00->data;
        offset = 0xffffffff;
        goto LAB_0082ac9e;
      }
    }
    else {
      local_130 = args->count;
      if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
        pdVar21 = vector->data;
        pdVar4 = vector_00->data;
        puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar23 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::SetValidity(result,&vector->validity);
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            lVar15 = 8;
            while (bVar24 = local_130 != 0, local_130 = local_130 - 1, bVar24) {
              input_07.value.pointer.ptr = (char *)*(undefined8 *)pdVar4;
              input_07.value._0_8_ = *(undefined8 *)(pdVar21 + lVar15);
              sVar26 = SubstringUnicode((duckdb *)result,*(Vector **)(pdVar21 + lVar15 + -8),
                                        input_07,0xffffffff,in_R9);
              *(long *)(pdVar23 + lVar15 + -8) = sVar26.value._0_8_;
              *(long *)(pdVar23 + lVar15) = sVar26.value._8_8_;
              lVar15 = lVar15 + 0x10;
            }
            return;
          }
          uVar9 = 0;
          uVar22 = 0;
          do {
            if (uVar9 == local_130 + 0x3f >> 6) {
              return;
            }
            puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar3 == (unsigned_long *)0x0) {
              uVar20 = uVar22 + 0x40;
              if (local_130 <= uVar22 + 0x40) {
                uVar20 = local_130;
              }
LAB_0082aed6:
              uVar12 = uVar22 << 4 | 8;
              for (; uVar6 = uVar22, uVar22 < uVar20; uVar22 = uVar22 + 1) {
                input_01.value.pointer.ptr = (char *)*(undefined8 *)pdVar4;
                input_01.value._0_8_ = *(undefined8 *)(pdVar21 + uVar12);
                sVar26 = SubstringUnicode((duckdb *)result,*(Vector **)(pdVar21 + (uVar12 - 8)),
                                          input_01,0xffffffff,in_R9);
                *(long *)(pdVar23 + (uVar12 - 8)) = sVar26.value._0_8_;
                *(long *)(pdVar23 + uVar12) = sVar26.value._8_8_;
                uVar12 = uVar12 + 0x10;
              }
            }
            else {
              uVar12 = puVar3[uVar9];
              uVar20 = uVar22 + 0x40;
              if (local_130 <= uVar22 + 0x40) {
                uVar20 = local_130;
              }
              if (uVar12 == 0xffffffffffffffff) goto LAB_0082aed6;
              uVar6 = uVar20;
              if (uVar12 != 0) {
                uVar17 = uVar22 << 4 | 8;
                for (uVar13 = 0; uVar6 = uVar22 + uVar13, uVar22 + uVar13 < uVar20;
                    uVar13 = uVar13 + 1) {
                  if ((uVar12 >> (uVar13 & 0x3f) & 1) != 0) {
                    input_02.value.pointer.ptr = (char *)*(undefined8 *)pdVar4;
                    input_02.value._0_8_ = *(undefined8 *)(pdVar21 + uVar17);
                    sVar26 = SubstringUnicode((duckdb *)result,*(Vector **)(pdVar21 + (uVar17 - 8)),
                                              input_02,0xffffffff,in_R9);
                    *(long *)(pdVar23 + (uVar17 - 8)) = sVar26.value._0_8_;
                    *(long *)(pdVar23 + uVar17) = sVar26.value._8_8_;
                  }
                  uVar17 = uVar17 + 0x10;
                }
              }
            }
            uVar9 = uVar9 + 1;
            uVar22 = uVar6;
          } while( true );
        }
      }
      else {
        if ((VVar1 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar2 != FLAT_VECTOR) {
          if (VVar2 == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
            pdVar21 = vector->data;
            pdVar4 = vector_00->data;
            Vector::SetVectorType(result,FLAT_VECTOR);
            pdVar23 = result->data;
            FlatVector::VerifyFlatVector(result);
            FlatVector::VerifyFlatVector(vector);
            FlatVector::SetValidity(result,&vector->validity);
            FlatVector::VerifyFlatVector(vector_00);
            ValidityMask::Combine(&result->validity,&vector_00->validity,local_130);
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              lVar15 = 0;
              while (bVar24 = local_130 != 0, local_130 = local_130 - 1, bVar24) {
                sVar26.value.pointer.ptr = (char *)*(undefined8 *)(pdVar4 + lVar15);
                sVar26.value._0_8_ = *(undefined8 *)(pdVar21 + lVar15 * 2 + 8);
                sVar26 = SubstringUnicode((duckdb *)result,*(Vector **)(pdVar21 + lVar15 * 2),sVar26
                                          ,0xffffffff,in_R9);
                *(long *)(pdVar23 + lVar15 * 2) = sVar26.value._0_8_;
                *(long *)(pdVar23 + lVar15 * 2 + 8) = sVar26.value._8_8_;
                lVar15 = lVar15 + 8;
              }
              return;
            }
            uVar9 = 0;
            uVar22 = 0;
            do {
              if (uVar9 == local_130 + 0x3f >> 6) {
                return;
              }
              puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar3 == (unsigned_long *)0x0) {
                uVar20 = uVar22 + 0x40;
                if (local_130 <= uVar22 + 0x40) {
                  uVar20 = local_130;
                }
LAB_0082b49e:
                uVar12 = uVar22 << 4 | 8;
                for (; uVar6 = uVar22, uVar22 < uVar20; uVar22 = uVar22 + 1) {
                  input_08.value.pointer.ptr = (char *)*(undefined8 *)(pdVar4 + uVar22 * 8);
                  input_08.value._0_8_ = *(undefined8 *)(pdVar21 + uVar12);
                  sVar26 = SubstringUnicode((duckdb *)result,*(Vector **)(pdVar21 + (uVar12 - 8)),
                                            input_08,0xffffffff,in_R9);
                  *(long *)(pdVar23 + (uVar12 - 8)) = sVar26.value._0_8_;
                  *(long *)(pdVar23 + uVar12) = sVar26.value._8_8_;
                  uVar12 = uVar12 + 0x10;
                }
              }
              else {
                uVar12 = puVar3[uVar9];
                uVar20 = uVar22 + 0x40;
                if (local_130 <= uVar22 + 0x40) {
                  uVar20 = local_130;
                }
                if (uVar12 == 0xffffffffffffffff) goto LAB_0082b49e;
                uVar6 = uVar20;
                if (uVar12 != 0) {
                  uVar13 = uVar22 << 4 | 8;
                  for (uVar17 = 0; uVar6 = uVar22 + uVar17, uVar22 + uVar17 < uVar20;
                      uVar17 = uVar17 + 1) {
                    if ((uVar12 >> (uVar17 & 0x3f) & 1) != 0) {
                      input_09.value.pointer.ptr =
                           (char *)*(undefined8 *)(pdVar4 + uVar17 * 8 + uVar22 * 8);
                      input_09.value._0_8_ = *(undefined8 *)(pdVar21 + uVar13);
                      sVar26 = SubstringUnicode((duckdb *)result,
                                                *(Vector **)(pdVar21 + (uVar13 - 8)),input_09,
                                                0xffffffff,in_R9);
                      *(long *)(pdVar23 + (uVar13 - 8)) = sVar26.value._0_8_;
                      *(long *)(pdVar23 + uVar13) = sVar26.value._8_8_;
                    }
                    uVar13 = uVar13 + 0x10;
                  }
                }
              }
              uVar9 = uVar9 + 1;
              uVar22 = uVar6;
            } while( true );
          }
          UnifiedVectorFormat::UnifiedVectorFormat(&adata);
          UnifiedVectorFormat::UnifiedVectorFormat(&bdata);
          Vector::ToUnifiedFormat(vector,local_130,&adata);
          Vector::ToUnifiedFormat(vector_00,local_130,&bdata);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar21 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (bdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              adata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            pdVar21 = pdVar21 + 8;
            for (iVar16 = 0; local_130 != iVar16; iVar16 = iVar16 + 1) {
              iVar19 = iVar16;
              if ((adata.sel)->sel_vector != (sel_t *)0x0) {
                iVar19 = (idx_t)(adata.sel)->sel_vector[iVar16];
              }
              iVar5 = iVar16;
              if ((bdata.sel)->sel_vector != (sel_t *)0x0) {
                iVar5 = (idx_t)(bdata.sel)->sel_vector[iVar16];
              }
              input_04.value.pointer.ptr = (char *)*(undefined8 *)(bdata.data + iVar5 * 8);
              input_04.value._0_8_ = *(undefined8 *)(adata.data + iVar19 * 0x10 + 8);
              sVar26 = SubstringUnicode((duckdb *)result,*(Vector **)(adata.data + iVar19 * 0x10),
                                        input_04,0xffffffff,in_R9);
              *(long *)(pdVar21 + -8) = sVar26.value._0_8_;
              *(long *)pdVar21 = sVar26.value._8_8_;
              pdVar21 = pdVar21 + 0x10;
            }
          }
          else {
            pdVar21 = pdVar21 + 8;
            for (iVar16 = 0; local_130 != iVar16; iVar16 = iVar16 + 1) {
              iVar19 = iVar16;
              if ((adata.sel)->sel_vector != (sel_t *)0x0) {
                iVar19 = (idx_t)(adata.sel)->sel_vector[iVar16];
              }
              iVar5 = iVar16;
              if ((bdata.sel)->sel_vector != (sel_t *)0x0) {
                iVar5 = (idx_t)(bdata.sel)->sel_vector[iVar16];
              }
              if (((adata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((adata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar19 >> 6] >> (iVar19 & 0x3f) & 1) != 0)) &&
                 ((bdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((bdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar5 >> 6] >> (iVar5 & 0x3f) & 1) != 0)))) {
                input_10.value.pointer.ptr = (char *)*(undefined8 *)(bdata.data + iVar5 * 8);
                input_10.value._0_8_ = *(undefined8 *)(adata.data + iVar19 * 0x10 + 8);
                sVar26 = SubstringUnicode((duckdb *)result,*(Vector **)(adata.data + iVar19 * 0x10),
                                          input_10,0xffffffff,in_R9);
                *(long *)(pdVar21 + -8) = sVar26.value._0_8_;
                *(long *)pdVar21 = sVar26.value._8_8_;
              }
              else {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar16);
              }
              pdVar21 = pdVar21 + 0x10;
            }
          }
          goto LAB_0082b0dc;
        }
        pdVar21 = vector->data;
        puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar4 = vector_00->data;
        if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar23 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector_00);
          FlatVector::SetValidity(result,&vector_00->validity);
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            pdVar23 = pdVar23 + 8;
            for (iVar16 = 0; local_130 != iVar16; iVar16 = iVar16 + 1) {
              input_11.value.pointer.ptr = (char *)*(undefined8 *)(pdVar4 + iVar16 * 8);
              input_11.value._0_8_ = *(undefined8 *)(pdVar21 + 8);
              sVar26 = SubstringUnicode((duckdb *)result,*(Vector **)pdVar21,input_11,0xffffffff,
                                        in_R9);
              *(long *)(pdVar23 + -8) = sVar26.value._0_8_;
              *(long *)pdVar23 = sVar26.value._8_8_;
              pdVar23 = pdVar23 + 0x10;
            }
            return;
          }
          uVar9 = 0;
          uVar22 = 0;
          do {
            if (uVar9 == local_130 + 0x3f >> 6) {
              return;
            }
            puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar3 == (unsigned_long *)0x0) {
              uVar20 = uVar22 + 0x40;
              if (local_130 <= uVar22 + 0x40) {
                uVar20 = local_130;
              }
LAB_0082b2c0:
              pdVar14 = pdVar23 + uVar22 * 0x10 + 8;
              for (; uVar6 = uVar22, uVar22 < uVar20; uVar22 = uVar22 + 1) {
                input_05.value.pointer.ptr = (char *)*(undefined8 *)(pdVar4 + uVar22 * 8);
                input_05.value._0_8_ = *(undefined8 *)(pdVar21 + 8);
                sVar26 = SubstringUnicode((duckdb *)result,*(Vector **)pdVar21,input_05,0xffffffff,
                                          in_R9);
                *(long *)(pdVar14 + -8) = sVar26.value._0_8_;
                *(long *)pdVar14 = sVar26.value._8_8_;
                pdVar14 = pdVar14 + 0x10;
              }
            }
            else {
              uVar12 = puVar3[uVar9];
              uVar20 = uVar22 + 0x40;
              if (local_130 <= uVar22 + 0x40) {
                uVar20 = local_130;
              }
              if (uVar12 == 0xffffffffffffffff) goto LAB_0082b2c0;
              uVar6 = uVar20;
              if (uVar12 != 0) {
                pdVar14 = pdVar23 + uVar22 * 0x10 + 8;
                for (uVar13 = 0; uVar6 = uVar22 + uVar13, uVar22 + uVar13 < uVar20;
                    uVar13 = uVar13 + 1) {
                  if ((uVar12 >> (uVar13 & 0x3f) & 1) != 0) {
                    input_06.value.pointer.ptr =
                         (char *)*(undefined8 *)(pdVar4 + uVar13 * 8 + uVar22 * 8);
                    input_06.value._0_8_ = *(undefined8 *)(pdVar21 + 8);
                    sVar26 = SubstringUnicode((duckdb *)result,*(Vector **)pdVar21,input_06,
                                              0xffffffff,in_R9);
                    *(long *)(pdVar14 + -8) = sVar26.value._0_8_;
                    *(long *)pdVar14 = sVar26.value._8_8_;
                  }
                  pdVar14 = pdVar14 + 0x10;
                }
              }
            }
            uVar9 = uVar9 + 1;
            uVar22 = uVar6;
          } while( true );
        }
      }
      Vector::SetVectorType(result,CONSTANT_VECTOR);
    }
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void SubstringFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &input_vector = args.data[0];
	auto &offset_vector = args.data[1];
	if (args.ColumnCount() == 3) {
		auto &length_vector = args.data[2];

		TernaryExecutor::Execute<string_t, int64_t, int64_t, string_t>(
		    input_vector, offset_vector, length_vector, result, args.size(),
		    [&](string_t input_string, int64_t offset, int64_t length) {
			    return OP::Substring(result, input_string, offset, length);
		    });
	} else {
		BinaryExecutor::Execute<string_t, int64_t, string_t>(
		    input_vector, offset_vector, result, args.size(), [&](string_t input_string, int64_t offset) {
			    return OP::Substring(result, input_string, offset, NumericLimits<uint32_t>::Maximum());
		    });
	}
}